

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O2

uint8_t __thiscall m6502::BCC(m6502 *this)

{
  uint8_t uVar1;
  undefined2 uVar2;
  ushort uVar3;
  
  if ((this->status & 1) == 0) {
    uVar1 = this->cycles;
    this->cycles = uVar1 + '\x01';
    uVar2 = this->pc;
    uVar3 = this->addrRel + uVar2;
    this->addrAbs = uVar3;
    if (0xff < (uVar2 ^ uVar3)) {
      this->cycles = uVar1 + '\x02';
    }
    this->pc = uVar3;
  }
  return '\0';
}

Assistant:

uint8_t BCC()
  {
    if (GetFlag(C) == 0)
    {
      ++cycles;
      addrAbs = pc + addrRel;
      if ((addrAbs & 0xFF00u) != (pc & 0xFF00u))
      {
        ++cycles;
      }
      pc = addrAbs;
    }
    return 0;
  }